

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O2

string * __thiscall
duckdb::MaterializedQueryResult::ToBox_abi_cxx11_
          (string *__return_storage_ptr__,MaterializedQueryResult *this,ClientContext *context,
          BoxRendererConfig *config)

{
  ColumnDataCollection *result;
  BoxRenderer renderer;
  undefined1 auStack_198 [184];
  undefined1 local_e0 [184];
  
  if ((this->super_QueryResult).super_BaseQueryResult.success == false) {
    ::std::operator+(__return_storage_ptr__,
                     &(this->super_QueryResult).super_BaseQueryResult.error.final_message,
                     anon_var_dwarf_3b2a754 + 8);
  }
  else if ((this->collection).
           super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
           .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
           (ColumnDataCollection *)0x0) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "Internal error - result was successful but there was no collection",
               (allocator *)auStack_198);
  }
  else {
    BoxRendererConfig::BoxRendererConfig((BoxRendererConfig *)local_e0,config);
    BoxRenderer::BoxRenderer((BoxRenderer *)auStack_198,(BoxRendererConfig *)local_e0);
    ::std::__cxx11::string::~string((string *)(local_e0 + 0x20));
    result = Collection(this);
    BoxRenderer::ToString
              ((string *)__return_storage_ptr__,(BoxRenderer *)auStack_198,context,
               &(this->super_QueryResult).super_BaseQueryResult.names,result);
    ::std::__cxx11::string::~string((string *)(auStack_198 + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

string MaterializedQueryResult::ToBox(ClientContext &context, const BoxRendererConfig &config) {
	if (!success) {
		return GetError() + "\n";
	}
	if (!collection) {
		return "Internal error - result was successful but there was no collection";
	}
	BoxRenderer renderer(config);
	return renderer.ToString(context, names, Collection());
}